

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filenames.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_10b7e1::assert_string_view_eq
          (anon_unknown_dwarf_10b7e1 *this,char *s,string_view sv)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  size_t len;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  size_t local_40;
  AssertHelper local_38;
  
  local_40 = strlen((char *)this);
  local_58.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)sv.data_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_50,"len","sv.size()",&local_40,(unsigned_long *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-filenames.cc"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (((local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_58.ptr_ + 8))();
    }
LAB_001f4a51:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_40 != 0) {
      uVar2 = 0;
      do {
        testing::internal::CmpHelperEQ<char,char>
                  (local_50,"s[i]","sv[i]",(char *)(this + uVar2),s + uVar2);
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_48.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-filenames.cc"
                     ,0x1d,pcVar3);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (((local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          goto LAB_001f4a51;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_40);
    }
  }
  return;
}

Assistant:

void assert_string_view_eq(const char* s, string_view sv) {
  size_t len = std::strlen(s);
  ASSERT_EQ(len, sv.size());
  for (size_t i = 0; i < len; ++i) {
    ASSERT_EQ(s[i], sv[i]);
  }
}